

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

int NGA_Update_ghost_dir(int g_a,int dimension,int dir,int flag)

{
  logical lVar1;
  logical st;
  logical iflag;
  Integer idir;
  Integer idim;
  Integer a;
  logical in_stack_00000840;
  Integer in_stack_00000848;
  Integer in_stack_00000850;
  Integer in_stack_00000858;
  
  lVar1 = pnga_update_ghost_dir
                    (in_stack_00000858,in_stack_00000850,in_stack_00000848,in_stack_00000840);
  return (int)lVar1;
}

Assistant:

int NGA_Update_ghost_dir(int g_a, int dimension, int dir, int flag)
{
    Integer a=(Integer)g_a;
    Integer idim = (Integer)dimension;
    Integer idir = (Integer)dir;
    logical iflag = (logical)flag;
    logical st;
    idim++;
    st = wnga_update_ghost_dir(a,idim,idir,iflag);
    return (int)st;
}